

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O1

char * get_apple_string(FT_Memory memory,FT_Stream stream,TT_Name entry,char_type_func char_type,
                       FT_Bool report_invalid_characters)

{
  uchar *puVar1;
  FT_Error FVar2;
  int iVar3;
  char *P;
  char *pcVar4;
  long lVar5;
  FT_Error error;
  int local_44;
  FT_Stream local_40;
  ulong local_38;
  
  P = (char *)ft_mem_qalloc(memory,(ulong)entry->stringLength + 1,&local_44);
  if (local_44 == 0) {
    local_44 = FT_Stream_Seek(stream,entry->stringOffset);
    if ((local_44 == 0) &&
       (local_44 = FT_Stream_EnterFrame(stream,(ulong)entry->stringLength), local_44 == 0)) {
      local_38 = (ulong)entry->stringLength;
      pcVar4 = P;
      FVar2 = 0;
      if (local_38 != 0) {
        puVar1 = stream->cursor;
        lVar5 = 0;
        local_40 = stream;
        do {
          iVar3 = (*char_type)((int)(char)puVar1[lVar5]);
          if (iVar3 == 0) {
            FT_Stream_ExitFrame(local_40);
            goto LAB_0024fa75;
          }
          P[lVar5] = puVar1[lVar5];
          lVar5 = lVar5 + 1;
        } while ((int)local_38 != (int)lVar5);
        pcVar4 = P + lVar5;
        stream = local_40;
        FVar2 = local_44;
      }
      local_44 = FVar2;
      *pcVar4 = '\0';
      FT_Stream_ExitFrame(stream);
      return P;
    }
LAB_0024fa75:
    ft_mem_free(memory,P);
    entry->stringOffset = 0;
    entry->stringLength = 0;
    ft_mem_free(memory,entry->string);
    entry->string = (FT_Byte *)0x0;
  }
  return (char *)0x0;
}

Assistant:

static char*
  get_apple_string( FT_Memory       memory,
                    FT_Stream       stream,
                    TT_Name         entry,
                    char_type_func  char_type,
                    FT_Bool         report_invalid_characters )
  {
    FT_Error  error;

    char*       result = NULL;
    FT_String*  r;
    FT_Char*    p;
    FT_UInt     len;


    if ( FT_QALLOC( result, entry->stringLength + 1 ) )
      return NULL;

    if ( FT_STREAM_SEEK( entry->stringOffset ) ||
         FT_FRAME_ENTER( entry->stringLength ) )
      goto get_apple_string_error;

    r = (FT_String*)result;
    p = (FT_Char*)stream->cursor;

    for ( len = entry->stringLength; len > 0; len--, p++ )
    {
      if ( char_type( *p ) )
        *r++ = *p;
      else
      {
        if ( report_invalid_characters )
          FT_TRACE0(( "get_apple_string:"
                      " Character `%c' (0x%X) invalid in PS name string\n",
                      *p, *p ));
        break;
      }
    }
    if ( !len )
      *r = '\0';

    FT_FRAME_EXIT();

    if ( !len )
      return result;

  get_apple_string_error:
    FT_FREE( result );

    entry->stringOffset = 0;
    entry->stringLength = 0;
    FT_FREE( entry->string );

    return NULL;
  }